

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObject::doSetObjectName(QObject *this,QString *name)

{
  QObjectPrivate *this_00;
  bool bVar1;
  
  this_00 = (QObjectPrivate *)(this->d_ptr).d;
  QObjectPrivate::ensureExtraData(this_00);
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper(&this_00->extraData->objectName);
  bVar1 = ::operator!=((QString *)&this_00->extraData->objectName,name);
  if (bVar1) {
    QString::operator=((QString *)&this_00->extraData->objectName,name);
    QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
    ::notify(&this_00->extraData->objectName);
    return;
  }
  return;
}

Assistant:

void QObject::doSetObjectName(const QString &name)
{
    Q_D(QObject);

    d->ensureExtraData();

    d->extraData->objectName.removeBindingUnlessInWrapper();

    if (d->extraData->objectName.valueBypassingBindings() != name) {
        d->extraData->objectName.setValueBypassingBindings(name);
        d->extraData->objectName.notify(); // also emits a signal
    }
}